

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall fasttext::Model::computeOutputSoftmax(Model *this,Vector *hidden,Vector *output)

{
  pointer pfVar1;
  pointer pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  ushort uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  double dVar27;
  uint uVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  float local_28;
  undefined1 auVar31 [64];
  
  computeOutput(this,hidden,output);
  pfVar2 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar29 = ZEXT464((uint)*pfVar2);
  if (0 < (long)this->osz_) {
    lVar20 = 0;
    do {
      auVar30 = vmaxss_avx(auVar29._0_16_,ZEXT416((uint)pfVar2[lVar20]));
      auVar29 = ZEXT1664(auVar30);
      lVar20 = lVar20 + 1;
    } while (this->osz_ != lVar20);
  }
  iVar19 = this->osz_;
  auVar30 = ZEXT816(0) << 0x40;
  auVar31 = ZEXT1664(auVar30);
  if (0 < iVar19) {
    lVar20 = 0;
    uVar28 = auVar29._0_4_;
    do {
      dVar27 = exp((double)((output->data_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar20] - auVar29._0_4_));
      local_28 = auVar31._0_4_;
      auVar29 = ZEXT464(uVar28);
      (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[lVar20] = (float)dVar27;
      local_28 = local_28 + (float)dVar27;
      auVar31 = ZEXT464((uint)local_28);
      auVar30 = ZEXT416((uint)local_28);
      lVar20 = lVar20 + 1;
      iVar19 = this->osz_;
    } while (lVar20 < iVar19);
  }
  if (0 < iVar19) {
    pfVar2 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar29 = vpbroadcastq_avx512f();
    auVar31 = vbroadcastss_avx512f(auVar30);
    uVar21 = 0;
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar25 = vpbroadcastq_avx512f();
      auVar26 = vporq_avx512f(auVar25,auVar23);
      auVar25 = vporq_avx512f(auVar25,auVar24);
      uVar16 = vpcmpuq_avx512f(auVar25,auVar29,2);
      bVar17 = (byte)uVar16;
      uVar16 = vpcmpuq_avx512f(auVar26,auVar29,2);
      bVar18 = (byte)uVar16;
      uVar22 = CONCAT11(bVar18,bVar17);
      pfVar1 = pfVar2 + uVar21;
      auVar25._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * (int)pfVar1[1];
      auVar25._0_4_ = (uint)(bVar17 & 1) * (int)*pfVar1;
      auVar25._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * (int)pfVar1[2];
      auVar25._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * (int)pfVar1[3];
      auVar25._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * (int)pfVar1[4];
      auVar25._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * (int)pfVar1[5];
      auVar25._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * (int)pfVar1[6];
      auVar25._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * (int)pfVar1[7];
      auVar25._32_4_ = (uint)(bVar18 & 1) * (int)pfVar1[8];
      auVar25._36_4_ = (uint)(bVar18 >> 1 & 1) * (int)pfVar1[9];
      auVar25._40_4_ = (uint)(bVar18 >> 2 & 1) * (int)pfVar1[10];
      auVar25._44_4_ = (uint)(bVar18 >> 3 & 1) * (int)pfVar1[0xb];
      auVar25._48_4_ = (uint)(bVar18 >> 4 & 1) * (int)pfVar1[0xc];
      auVar25._52_4_ = (uint)(bVar18 >> 5 & 1) * (int)pfVar1[0xd];
      auVar25._56_4_ = (uint)(bVar18 >> 6 & 1) * (int)pfVar1[0xe];
      auVar25._60_4_ = (uint)(bVar18 >> 7) * (int)pfVar1[0xf];
      auVar25 = vdivps_avx512f(auVar25,auVar31);
      pfVar1 = pfVar2 + uVar21;
      bVar3 = (bool)((byte)(uVar22 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar22 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar22 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar22 >> 6) & 1);
      bVar9 = (bool)((byte)(uVar22 >> 7) & 1);
      bVar10 = (bool)(bVar18 >> 1 & 1);
      bVar11 = (bool)(bVar18 >> 2 & 1);
      bVar12 = (bool)(bVar18 >> 3 & 1);
      bVar13 = (bool)(bVar18 >> 4 & 1);
      bVar14 = (bool)(bVar18 >> 5 & 1);
      bVar15 = (bool)(bVar18 >> 6 & 1);
      *pfVar1 = (float)((uint)(bVar17 & 1) * auVar25._0_4_ |
                       (uint)!(bool)(bVar17 & 1) * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar4 * auVar25._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)bVar6 * auVar25._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar7 * auVar25._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar8 * auVar25._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)bVar9 * auVar25._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
      pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar25._32_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
      pfVar1[9] = (float)((uint)bVar10 * auVar25._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
      pfVar1[10] = (float)((uint)bVar11 * auVar25._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
      pfVar1[0xb] = (float)((uint)bVar12 * auVar25._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
      pfVar1[0xc] = (float)((uint)bVar13 * auVar25._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
      pfVar1[0xd] = (float)((uint)bVar14 * auVar25._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
      pfVar1[0xe] = (float)((uint)bVar15 * auVar25._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
      pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar25._60_4_ |
                           (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
      uVar21 = uVar21 + 0x10;
    } while ((iVar19 + 0xfU & 0xfffffff0) != uVar21);
  }
  return;
}

Assistant:

void Model::computeOutputSoftmax(Vector& hidden, Vector& output) const {
	computeOutput(hidden, output);
	real max = output[0], z = 0.0;
	for (int32_t i = 0; i < osz_; i++) {
		max = std::max(output[i], max);
	}
	for (int32_t i = 0; i < osz_; i++) {
		// std::cout << output[i] << ":";
		output[i] = exp(output[i] - max);
		z += output[i];
		// std::cout << output[i] << " ";
		
	}

	// std::cout << z << std::endl;
	for (int32_t i = 0; i < osz_; i++) {
		output[i] /= z;
	}
}